

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_before.c
# Opt level: O0

mpt_node * mpt_gnode_before(mpt_node *position,mpt_node *insert)

{
  int *piVar1;
  mpt_node *insert_local;
  mpt_node *position_local;
  
  if (insert == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    position_local = (mpt_node *)0x0;
  }
  else {
    position_local = insert;
    if ((position != (mpt_node *)0x0) && (insert != position)) {
      insert->prev = position->prev;
      insert->next = position;
      position->prev = insert;
      insert->parent = position->parent;
      if (insert->prev == (mpt_node *)0x0) {
        if (insert->parent != (mpt_node *)0x0) {
          insert->parent->children = insert;
        }
      }
      else {
        insert->prev->next = insert;
      }
    }
  }
  return position_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_before(MPT_STRUCT(node) *position, MPT_STRUCT(node) *insert)
{
	if ( !insert ) {
		errno = EFAULT; return 0;
	}
	
	/* no previous node, avoid self-reference */
	if ( !position || insert == position )
		return insert;
	
	/* avoid self-reference */
	insert->prev = position->prev;
	insert->next = position;
	position->prev = insert;
	
	insert->parent = position->parent;
	
	if ( (position = insert->prev) )
		position->next = insert;
	else if ( (position = insert->parent) )
		position->children = insert;
	
	/* return inserted node */
	return insert;
}